

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O0

int sptk::snack::window(float *din,float *dout,int n,float preemp,int type,int *wsizep,float **windp
                       )

{
  uint in_ECX;
  int in_EDX;
  float *in_RSI;
  float **in_RDI;
  float in_XMM0_Da;
  float unaff_retaddr;
  int unaff_retaddr_00;
  float *in_stack_00000008;
  undefined4 in_stack_00000020;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  switch(in_ECX) {
  case 0:
    xrwindow((float *)in_RDI,in_RSI,in_EDX,in_XMM0_Da);
    break;
  case 1:
    xhwindow((float *)windp,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
             (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    break;
  case 2:
    xcwindow((float *)CONCAT44(type,in_stack_00000020),(float *)wsizep,windp._4_4_,windp._0_4_,
             (int *)in_stack_00000008,(float **)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    break;
  case 3:
    xhnwindow((float *)CONCAT44(type,in_stack_00000020),(float *)wsizep,windp._4_4_,windp._0_4_,
              (int *)in_stack_00000008,(float **)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    break;
  default:
    fprintf(_stderr,"Unknown window type (%d) requested in window()\n",(ulong)in_ECX);
    return 0;
  }
  return 1;
}

Assistant:

int window(float *din, float *dout, int n, float preemp, int type,
           int *wsizep, float **windp)
#endif
{
  switch(type) {
  case 0:			/* rectangular */
    xrwindow(din, dout, n, preemp);
    break;
  case 1:			/* Hamming */
#if 0
    xhwindow(din, dout, n, preemp);
#else
    xhwindow(din, dout, n, preemp, wsizep, windp);
#endif
    break;
  case 2:			/* cos^4 */
#if 0
    xcwindow(din, dout, n, preemp);
#else
    xcwindow(din, dout, n, preemp, wsizep, windp);
#endif
    break;
  case 3:			/* Hanning */
#if 0
    xhnwindow(din, dout, n, preemp);
#else
    xhnwindow(din, dout, n, preemp, wsizep, windp);
#endif
    break;
  default:
    Fprintf(stderr,"Unknown window type (%d) requested in window()\n",type);
    return(FALSE);
  }
  return(TRUE);
}